

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void buildshifts(lemon *lemp,state *stp)

{
  symbol *sp_00;
  int iVar1;
  config *pcVar2;
  state *arg;
  int local_4c;
  int i;
  state *newstp;
  symbol *bsp;
  symbol *sp;
  config *newcfg;
  config *bcfp;
  config *cfp;
  state *stp_local;
  lemon *lemp_local;
  
  for (bcfp = stp->cfp; bcfp != (config *)0x0; bcfp = bcfp->next) {
    bcfp->status = INCOMPLETE;
  }
  for (bcfp = stp->cfp; bcfp != (config *)0x0; bcfp = bcfp->next) {
    if ((bcfp->status != COMPLETE) && (bcfp->dot < bcfp->rp->nrhs)) {
      Configlist_reset();
      sp_00 = bcfp->rp->rhs[bcfp->dot];
      for (newcfg = bcfp; newcfg != (config *)0x0; newcfg = newcfg->next) {
        if (((newcfg->status != COMPLETE) && (newcfg->dot < newcfg->rp->nrhs)) &&
           (iVar1 = same_symbol(newcfg->rp->rhs[newcfg->dot],sp_00), iVar1 != 0)) {
          newcfg->status = COMPLETE;
          pcVar2 = Configlist_addbasis(newcfg->rp,newcfg->dot + 1);
          Plink_add(&pcVar2->bplp,newcfg);
        }
      }
      arg = getstate(lemp);
      if (sp_00->type == MULTITERMINAL) {
        for (local_4c = 0; local_4c < sp_00->nsubsym; local_4c = local_4c + 1) {
          Action_add(&stp->ap,SHIFT,sp_00->subsym[local_4c],(char *)arg);
        }
      }
      else {
        Action_add(&stp->ap,SHIFT,sp_00,(char *)arg);
      }
    }
  }
  return;
}

Assistant:

PRIVATE void buildshifts(struct lemon *lemp, struct state *stp)
{
  struct config *cfp;  /* For looping thru the config closure of "stp" */
  struct config *bcfp; /* For the inner loop on config closure of "stp" */
  struct config *newcfg;  /* */
  struct symbol *sp;   /* Symbol following the dot in configuration "cfp" */
  struct symbol *bsp;  /* Symbol following the dot in configuration "bcfp" */
  struct state *newstp; /* A pointer to a successor state */

  /* Each configuration becomes complete after it contibutes to a successor
  ** state.  Initially, all configurations are incomplete */
  for(cfp=stp->cfp; cfp; cfp=cfp->next) cfp->status = INCOMPLETE;

  /* Loop through all configurations of the state "stp" */
  for(cfp=stp->cfp; cfp; cfp=cfp->next){
    if( cfp->status==COMPLETE ) continue;    /* Already used by inner loop */
    if( cfp->dot>=cfp->rp->nrhs ) continue;  /* Can't shift this config */
    Configlist_reset();                      /* Reset the new config set */
    sp = cfp->rp->rhs[cfp->dot];             /* Symbol after the dot */

    /* For every configuration in the state "stp" which has the symbol "sp"
    ** following its dot, add the same configuration to the basis set under
    ** construction but with the dot shifted one symbol to the right. */
    for(bcfp=cfp; bcfp; bcfp=bcfp->next){
      if( bcfp->status==COMPLETE ) continue;    /* Already used */
      if( bcfp->dot>=bcfp->rp->nrhs ) continue; /* Can't shift this one */
      bsp = bcfp->rp->rhs[bcfp->dot];           /* Get symbol after dot */
      if( !same_symbol(bsp,sp) ) continue;      /* Must be same as for "cfp" */
      bcfp->status = COMPLETE;                  /* Mark this config as used */
      newcfg = Configlist_addbasis(bcfp->rp,bcfp->dot+1);
      Plink_add(&newcfg->bplp,bcfp);
    }

    /* Get a pointer to the state described by the basis configuration set
    ** constructed in the preceding loop */
    newstp = getstate(lemp);

    /* The state "newstp" is reached from the state "stp" by a shift action
    ** on the symbol "sp" */
    if( sp->type==MULTITERMINAL ){
      int i;
      for(i=0; i<sp->nsubsym; i++){
        Action_add(&stp->ap,SHIFT,sp->subsym[i],(char*)newstp);
      }
    }else{
      Action_add(&stp->ap,SHIFT,sp,(char *)newstp);
    }
  }
}